

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_globalz_set_table_gej
               (size_t len,secp256k1_ge *r,secp256k1_fe *globalz,secp256k1_gej *a,secp256k1_fe *zr)

{
  long in_RCX;
  void *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_gej *in_RDI;
  long in_R8;
  secp256k1_fe zs;
  size_t i;
  secp256k1_fe *in_stack_ffffffffffffffa8;
  secp256k1_fe *in_stack_ffffffffffffffb0;
  undefined1 *local_30;
  
  local_30 = &in_RDI[-1].field_0x7f;
  if (in_RDI != (secp256k1_gej *)0x0) {
    memcpy((void *)((long)in_RSI + (long)local_30 * 0x58),(void *)(in_RCX + (long)local_30 * 0x80),
           0x28);
    memcpy((void *)((long)in_RSI + (long)local_30 * 0x58 + 0x28),
           (void *)(in_RCX + (long)local_30 * 0x80 + 0x28),0x28);
    memcpy(in_RDX,(void *)(in_RCX + (long)local_30 * 0x80 + 0x50),0x28);
    *(undefined4 *)((long)in_RSI + (long)local_30 * 0x58 + 0x50) = 0;
    memcpy(&stack0xffffffffffffffa8,(void *)(in_R8 + (long)local_30 * 0x28),0x28);
    while (local_30 != (undefined1 *)0x0) {
      if (local_30 != &in_RDI[-1].field_0x7f) {
        secp256k1_fe_mul(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         (secp256k1_fe *)0x121fa9);
      }
      local_30 = local_30 + -1;
      secp256k1_ge_set_gej_zinv((secp256k1_ge *)zs.n[0],in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_globalz_set_table_gej(size_t len, secp256k1_ge *r, secp256k1_fe *globalz, const secp256k1_gej *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* The z of the final point gives us the "global Z" for the table. */
        r[i].x = a[i].x;
        r[i].y = a[i].y;
        *globalz = a[i].z;
        r[i].infinity = 0;
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &zs);
        }
    }
}